

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLibUtil.c
# Opt level: O2

int Abc_SclComputeParametersCell(SC_Lib *p,SC_Cell *pCell,float Slew,float *pLD,float *pPD)

{
  int iVar1;
  int i;
  SC_Lib *p_00;
  float fVar2;
  float fVar3;
  float pd;
  float ld;
  float *local_38;
  
  pd = 0.0;
  ld = 0.0;
  i = 0;
  fVar3 = 0.0;
  fVar2 = 0.0;
  local_38 = pPD;
  while( true ) {
    iVar1 = pCell->n_inputs;
    if (iVar1 <= i) {
      if (iVar1 < 2) {
        iVar1 = 1;
      }
      *pLD = fVar3 / (float)iVar1;
      *local_38 = fVar2 / (float)iVar1;
      return 1;
    }
    p_00 = (SC_Lib *)&pCell->vPins;
    Vec_PtrEntry(&pCell->vPins,i);
    iVar1 = Abc_SclComputeParametersPin(p_00,pCell,i,Slew,&ld,&pd);
    if (iVar1 == 0) break;
    fVar3 = fVar3 + ld;
    fVar2 = fVar2 + pd;
    i = i + 1;
  }
  return 0;
}

Assistant:

int Abc_SclComputeParametersCell( SC_Lib * p, SC_Cell * pCell, float Slew, float * pLD, float * pPD )
{
    SC_Pin * pPin;
    float LD, PD, ld, pd;
    int i;
    LD = PD = ld = pd = 0;
    SC_CellForEachPinIn( pCell, pPin, i )
    {
        if ( !Abc_SclComputeParametersPin( p, pCell, i, Slew, &ld, &pd ) )
            return 0;
        LD += ld; PD += pd;
    }
    *pLD = LD / Abc_MaxInt(1, pCell->n_inputs);
    *pPD = PD / Abc_MaxInt(1, pCell->n_inputs);
    return 1;
}